

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test::TestBody
          (BlockSizes_ReadStringReservesMemoryOnTotalLimit_Test *this)

{
  bool bVar1;
  ParamType_conflict *pPVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_e0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  string str;
  AssertHelper local_88;
  CodedInputStream coded_input;
  ArrayInputStream input;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  io::(anonymous_namespace)::CodedStreamTest::buffer_ = 'S';
  DAT_01711951 = 'o';
  DAT_01711952 = 'm';
  DAT_01711953 = 'e';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._3_1_ = ' ';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._4_1_ = 'b';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._5_1_ = 'y';
  io::(anonymous_namespace)::CodedStreamTest::buffer__1._6_1_ = 't';
  DAT_01711958 = 'e';
  DAT_01711958_1._0_1_ = 's';
  DAT_01711958_1._1_1_ = ' ';
  DAT_01711958_1._2_1_ = 'w';
  DAT_01711958_1._3_1_ = 'h';
  DAT_01711958_1._4_1_ = 'i';
  DAT_01711958_1._5_1_ = 'c';
  DAT_01711958_1._6_1_ = 'h';
  DAT_01711960 = ' ';
  DAT_01711960_1._0_1_ = 'w';
  DAT_01711960_1._1_1_ = 'i';
  DAT_01711960_1._2_1_ = 'l';
  DAT_01711960_1._3_1_ = 'l';
  DAT_01711960_1._4_1_ = ' ';
  DAT_01711960_1._5_1_ = 'b';
  DAT_01711960_1._6_1_ = 'e';
  uRam0000000001711968 = 0x65747469727720;
  DAT_0171196f = 0x6e;
  _DAT_01711970 = 0x657220646e6120;
  uRam0000000001711977._0_1_ = 'a';
  uRam0000000001711977._1_1_ = 'd';
  uRam0000000001711977._2_1_ = ' ';
  uRam0000000001711977._3_1_ = 'r';
  uRam0000000001711977._4_1_ = 'a';
  uRam0000000001711977._5_1_ = 'w';
  uRam0000000001711977._6_1_ = '.';
  uRam0000000001711977._7_1_ = '\0';
  ArrayInputStream::ArrayInputStream
            (&input,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*pPVar2);
  CodedInputStream::CodedInputStream(&coded_input,&input.super_ZeroCopyInputStream);
  CodedInputStream::SetTotalBytesLimit(&coded_input,0x2f);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0;
  gtest_ar_._0_4_ = CodedInputStream::BytesUntilTotalBytesLimit(&coded_input);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&str,"sizeof(kRawBytes)","coded_input.BytesUntilTotalBytesLimit()",
             (unsigned_long *)&gtest_ar_1,(int *)&gtest_ar_);
  if ((char)str._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (str._M_string_length == 0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)str._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x32d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&str._M_string_length);
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  str._M_dataplus._M_p = (pointer)&str.field_2;
  bVar1 = CodedInputStream::ReadString(&coded_input,&str,0x2e);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
               (AssertionResult *)"coded_input.ReadString(&str, strlen(kRawBytes))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x330,(char *)gtest_ar_1._0_8_);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_e0.data_._0_4_ = CodedInputStream::BytesUntilTotalBytesLimit(&coded_input);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_1,"sizeof(kRawBytes) - strlen(kRawBytes)",
             "coded_input.BytesUntilTotalBytesLimit()",(unsigned_long *)&gtest_ar_,(int *)&local_e0)
  ;
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x332,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  testing::internal::CmpHelperEQ<char[47],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"kRawBytes","str",
             (char (*) [47])"Some bytes which will be written and read raw.",&str);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p == &str.field_2) {
    gtest_ar_.success_ = true;
    gtest_ar_._1_7_ = 0;
  }
  else {
    gtest_ar_._1_7_ = str.field_2._M_allocated_capacity._1_7_;
    gtest_ar_.success_ = (bool)str.field_2._M_local_buf[0];
  }
  local_e0.data_ = (AssertHelperData *)0x2e;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_1,"str.capacity()","strlen(kRawBytes)",
             (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_e0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x335,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&str);
  CodedInputStream::~CodedInputStream(&coded_input);
  str._M_dataplus._M_p = &DAT_0000002e;
  gtest_ar_1._0_8_ = ArrayInputStream::ByteCount(&input);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)&coded_input,"strlen(kRawBytes)","input.ByteCount()",(unsigned_long *)&str,
             (long *)&gtest_ar_1);
  if ((char)coded_input.buffer_ == '\0') {
    testing::Message::Message((Message *)&str);
    if (coded_input.buffer_end_ == (uint8_t *)0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)coded_input.buffer_end_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x338,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&str);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (str._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)str._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&coded_input.buffer_end_);
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringReservesMemoryOnTotalLimit) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);
    coded_input.SetTotalBytesLimit(sizeof(kRawBytes));
    EXPECT_EQ(sizeof(kRawBytes), coded_input.BytesUntilTotalBytesLimit());

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen(kRawBytes)));
    EXPECT_EQ(sizeof(kRawBytes) - strlen(kRawBytes),
              coded_input.BytesUntilTotalBytesLimit());
    EXPECT_EQ(kRawBytes, str);
    // TODO: Replace with a more meaningful test (see cl/60966023).
    EXPECT_GE(str.capacity(), strlen(kRawBytes));
  }

  EXPECT_EQ(strlen(kRawBytes), input.ByteCount());
}